

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.h
# Opt level: O1

bool wasm::Match::Internal::
     Components<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_0,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
     ::match(matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_>
             candidate,
            SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
            *matchers)

{
  matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_> pBVar1;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  *pMVar2;
  matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *ppEVar3;
  matched_t<wasm::Const_*> pCVar4;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  *pMVar5;
  matched_t<wasm::Const_*> *ppCVar6;
  bool bVar7;
  Literal local_40;
  
  pBVar1 = (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_>)
           candidate->left;
  if ((pBVar1->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id != BinaryId)
  {
    return false;
  }
  pMVar2 = matchers->curr;
  if (pMVar2->binder !=
      (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_> *)0x0) {
    *pMVar2->binder = pBVar1;
  }
  if (pBVar1->op == pMVar2->data) {
    ppEVar3 = ((pMVar2->submatchers).curr)->binder;
    if (ppEVar3 != (matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)0x0) {
      *ppEVar3 = pBVar1->left;
    }
    pCVar4 = (matched_t<wasm::Const_*>)pBVar1->right;
    if ((pCVar4->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression._id != ConstId
       ) {
      return false;
    }
    pMVar5 = (pMVar2->submatchers).next.curr;
    ppCVar6 = pMVar5->binder;
    if (ppCVar6 != (matched_t<wasm::Const_*> *)0x0) {
      *ppCVar6 = pCVar4;
    }
    Literal::Literal(&local_40,&pCVar4->value);
    bVar7 = Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
            ::matches(&(pMVar5->submatchers).curr,&local_40);
    Literal::~Literal(&local_40);
    if (bVar7) {
      pCVar4 = (matched_t<wasm::Const_*>)candidate->right;
      if ((pCVar4->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression._id !=
          ConstId) {
        return false;
      }
      pMVar5 = (matchers->next).curr;
      ppCVar6 = pMVar5->binder;
      if (ppCVar6 != (matched_t<wasm::Const_*> *)0x0) {
        *ppCVar6 = pCVar4;
      }
      Literal::Literal(&local_40,&pCVar4->value);
      bVar7 = Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
              ::matches(&(pMVar5->submatchers).curr,&local_40);
      Literal::~Literal(&local_40);
      return bVar7;
    }
  }
  return false;
}

Assistant:

static inline bool
  match(matched_t<Kind> candidate,
        SubMatchers<CurrMatcher, NextMatchers...>& matchers) {
    return matchers.curr.matches(GetComponent<Kind, pos>{}(candidate)) &&
           Components<Kind, pos + 1, NextMatchers...>::match(candidate,
                                                             matchers.next);
  }